

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int xmlwrite_fstring(archive_write *a,xml_writer *writer,char *key,char *fmt,...)

{
  void *pvVar1;
  char in_AL;
  int iVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_f8.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  pvVar1 = a->format_data;
  local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_f8.gp_offset = 0x20;
  local_f8.fp_offset = 0x30;
  *(undefined8 *)((long)pvVar1 + 0x70) = 0;
  local_b8 = in_R8;
  local_b0 = in_R9;
  archive_string_vsprintf((archive_string *)((long)pvVar1 + 0x68),fmt,&local_f8);
  iVar2 = xmlwrite_string(a,writer,key,*(char **)((long)pvVar1 + 0x68));
  return iVar2;
}

Assistant:

static int
xmlwrite_fstring(struct archive_write *a, struct xml_writer *writer,
	const char *key, const char *fmt, ...)
{
	struct xar *xar;
	va_list ap;

	xar = (struct xar *)a->format_data;
	va_start(ap, fmt);
	archive_string_empty(&xar->vstr);
	archive_string_vsprintf(&xar->vstr, fmt, ap);
	va_end(ap);
	return (xmlwrite_string(a, writer, key, xar->vstr.s));
}